

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5MergeRowidLists(Fts5Index *p,Fts5Buffer *p1,Fts5Buffer *p2)

{
  undefined8 uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  u8 *puVar5;
  u8 *puVar6;
  uint uVar7;
  int i;
  uint uVar8;
  u8 *puVar9;
  bool bVar10;
  u64 iVal;
  u8 *local_78 [3];
  int local_5c;
  Fts5Buffer local_58;
  Fts5Buffer *local_40;
  u8 *local_38;
  
  local_58.p = (u8 *)0x0;
  local_58.n = 0;
  local_58.nSpace = 0;
  sqlite3Fts5BufferSize(&p->rc,&local_58,p2->n + p1->n);
  if (p->rc != 0) {
    return;
  }
  local_40 = p2;
  if (p1->n < 1) {
    uVar7 = 0xffffffff;
    puVar9 = (u8 *)0x0;
  }
  else {
    bVar3 = sqlite3Fts5GetVarint(p1->p,(u64 *)local_78);
    uVar7 = (uint)bVar3;
    puVar9 = local_78[0];
  }
  if (local_40->n < 1) {
    bVar10 = (int)uVar7 >= 0;
    if ((int)uVar7 < 0) goto LAB_001cd0e6;
    puVar5 = (u8 *)0x0;
    uVar8 = 0xffffffff;
  }
  else {
    bVar3 = sqlite3Fts5GetVarint(local_40->p,(u64 *)local_78);
    uVar8 = (uint)bVar3;
    bVar10 = -1 < (int)uVar7;
    puVar5 = local_78[0];
  }
  local_38 = local_58.p;
  puVar6 = (u8 *)0x0;
  iVar4 = local_58.n;
  do {
    local_5c = iVar4;
    if ((bVar10) && (((int)uVar8 < 0 || ((long)puVar9 < (long)puVar5)))) {
      iVar4 = sqlite3Fts5PutVarint(local_38 + iVar4,(long)puVar9 - (long)puVar6);
      puVar6 = puVar9;
      if ((int)uVar7 < p1->n) {
        bVar3 = sqlite3Fts5GetVarint(p1->p + uVar7,(u64 *)local_78);
        uVar7 = uVar7 + bVar3;
        puVar9 = local_78[0] + (long)puVar9;
      }
      else {
        uVar7 = 0xffffffff;
      }
    }
    else {
      iVar4 = sqlite3Fts5PutVarint(local_38 + iVar4,(long)puVar5 - (long)puVar6);
      uVar2 = uVar7;
      if (((bool)(bVar10 & puVar9 == puVar5)) &&
         (puVar9 = puVar5, uVar2 = 0xffffffff, (int)uVar7 < p1->n)) {
        bVar3 = sqlite3Fts5GetVarint(p1->p + uVar7,(u64 *)local_78);
        puVar9 = local_78[0] + (long)puVar5;
        uVar2 = bVar3 + uVar7;
      }
      uVar7 = uVar2;
      puVar6 = puVar5;
      if ((int)uVar8 < local_40->n) {
        bVar3 = sqlite3Fts5GetVarint(local_40->p + (int)uVar8,(u64 *)local_78);
        uVar8 = uVar8 + bVar3;
        puVar5 = local_78[0] + (long)puVar5;
      }
      else {
        uVar8 = 0xffffffff;
      }
    }
    iVar4 = iVar4 + local_5c;
    bVar10 = -1 < (int)uVar7;
  } while ((bVar10) || (-1 < (int)uVar8));
  local_58.n = iVar4;
LAB_001cd0e6:
  local_78[0] = local_58.p;
  local_78[1] = (u8 *)local_58._8_8_;
  puVar9 = p1->p;
  uVar1._0_4_ = p1->n;
  uVar1._4_4_ = p1->nSpace;
  p1->p = local_58.p;
  p1->n = local_58.n;
  p1->nSpace = local_58.nSpace;
  local_58.p = puVar9;
  local_58._8_8_ = uVar1;
  sqlite3_free(puVar9);
  return;
}

Assistant:

static void fts5MergeRowidLists(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Buffer *p1,                 /* First list to merge */
  Fts5Buffer *p2                  /* Second list to merge */
){
  int i1 = 0;
  int i2 = 0;
  i64 iRowid1 = 0;
  i64 iRowid2 = 0;
  i64 iOut = 0;

  Fts5Buffer out;
  memset(&out, 0, sizeof(out));
  sqlite3Fts5BufferSize(&p->rc, &out, p1->n + p2->n);
  if( p->rc ) return;

  fts5NextRowid(p1, &i1, &iRowid1);
  fts5NextRowid(p2, &i2, &iRowid2);
  while( i1>=0 || i2>=0 ){
    if( i1>=0 && (i2<0 || iRowid1<iRowid2) ){
      assert( iOut==0 || iRowid1>iOut );
      fts5BufferSafeAppendVarint(&out, iRowid1 - iOut);
      iOut = iRowid1;
      fts5NextRowid(p1, &i1, &iRowid1);
    }else{
      assert( iOut==0 || iRowid2>iOut );
      fts5BufferSafeAppendVarint(&out, iRowid2 - iOut);
      iOut = iRowid2;
      if( i1>=0 && iRowid1==iRowid2 ){
        fts5NextRowid(p1, &i1, &iRowid1);
      }
      fts5NextRowid(p2, &i2, &iRowid2);
    }
  }

  fts5BufferSwap(&out, p1);
  fts5BufferFree(&out);
}